

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::PReLUParameter::PReLUParameter(PReLUParameter *this,PReLUParameter *from)

{
  void *pvVar1;
  FillerParameter *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__PReLUParameter_0071f1f0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (((from->_has_bits_).has_bits_[0] & 1) == 0) {
    this_00 = (FillerParameter *)0x0;
  }
  else {
    this_00 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(this_00,from->filler_);
  }
  this->filler_ = this_00;
  this->channel_shared_ = from->channel_shared_;
  return;
}

Assistant:

PReLUParameter::PReLUParameter(const PReLUParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_filler()) {
    filler_ = new ::caffe::FillerParameter(*from.filler_);
  } else {
    filler_ = NULL;
  }
  channel_shared_ = from.channel_shared_;
  // @@protoc_insertion_point(copy_constructor:caffe.PReLUParameter)
}